

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colmatrix_test.cc
# Opt level: O2

void __thiscall
fizplex::ColMatrix_MatrixMultiplicationWithIdentity_Test::TestBody
          (ColMatrix_MatrixMultiplicationWithIdentity_Test *this)

{
  long lVar1;
  char *pcVar2;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  initializer_list<fizplex::SVector::Nonzero> l_01;
  initializer_list<fizplex::SVector> colList;
  undefined1 local_140 [48];
  SVector local_110;
  AssertionResult gtest_ar;
  Nonzero local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ColMatrix m;
  ColMatrix idnt;
  Nonzero local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  ColMatrix::identity(&idnt,3);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x401c000000000000;
  l._M_len = 3;
  l._M_array = (iterator)&gtest_ar;
  SVector::SVector((SVector *)local_140,l);
  local_a8 = 2;
  uStack_a0 = 0x4010000000000000;
  local_b8 = 1;
  uStack_b0 = 0x4008000000000000;
  local_c8.index = 0;
  local_c8.value = 2.0;
  l_00._M_len = 3;
  l_00._M_array = &local_c8;
  SVector::SVector((SVector *)(local_140 + 0x18),l_00);
  local_28 = 2;
  uStack_20 = 0xc000000000000000;
  local_38 = 1;
  puStack_30 = &DAT_bff0000000000000;
  local_48.index = 0;
  local_48.value = 1.0;
  l_01._M_len = 3;
  l_01._M_array = &local_48;
  SVector::SVector(&local_110,l_01);
  colList._M_len = 3;
  colList._M_array = (iterator)local_140;
  ColMatrix::ColMatrix(&m,3,3,colList);
  lVar1 = 0x30;
  do {
    std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
    ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                   *)(local_140 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  ColMatrix::operator*((ColMatrix *)local_140,&idnt,&m);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&gtest_ar,"m","idnt * m",&m,(ColMatrix *)local_140);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_140);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_140);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ColMatrix::operator*((ColMatrix *)local_140,&m,&idnt);
  testing::internal::CmpHelperEQ<fizplex::ColMatrix,fizplex::ColMatrix>
            ((internal *)&gtest_ar,"m","m * idnt",&m,(ColMatrix *)local_140);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector
            ((vector<fizplex::SVector,_std::allocator<fizplex::SVector>_> *)local_140);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_140);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/colmatrix_test.cc"
               ,0x6a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c8,(Message *)local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_140);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&m.cols);
  std::vector<fizplex::SVector,_std::allocator<fizplex::SVector>_>::~vector(&idnt.cols);
  return;
}

Assistant:

TEST(ColMatrix, MatrixMultiplicationWithIdentity) {
  const auto idnt = ColMatrix::identity(3);
  const ColMatrix m(3, 3,
                    {{{0, 7}, {2, -3}, {1, 0.0}},
                     {{0, 2}, {1, 3}, {2, 4}},
                     {{0, 1}, {1, -1}, {2, -2}}});
  EXPECT_EQ(m, idnt * m);
  EXPECT_EQ(m, m * idnt);
}